

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::multipredict<false,false>
               (gd *g,base_learner *param_2,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  double dVar1;
  long *plVar2;
  float *pfVar3;
  example *in_RCX;
  long in_RDX;
  long in_RDI;
  vw *in_R8;
  long in_R9;
  float fVar4;
  size_t c_2;
  size_t c_1;
  multipredict_info<dense_parameters> mp_1;
  multipredict_info<sparse_parameters> mp;
  size_t c;
  vw *all;
  example *peVar5;
  multipredict_info<sparse_parameters> *in_stack_ffffffffffffff60;
  example *in_stack_ffffffffffffff68;
  vw *in_stack_ffffffffffffff70;
  example *local_48;
  
  plVar2 = *(long **)(in_RDI + 0x60);
  for (local_48 = (example *)0x0; local_48 < in_RCX;
      local_48 = (example *)((long)&(local_48->super_example_predict).indices._begin + 1)) {
    *(undefined4 *)(in_R9 + (long)local_48 * 0x20) = *(undefined4 *)(in_RDX + 0x6830);
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x60) + 0x3590) & 1) == 0) {
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (in_R8,in_RCX,(multipredict_info<dense_parameters> *)in_stack_ffffffffffffff60);
  }
  else {
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  dVar1 = *(double *)(*plVar2 + 0x60);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    for (peVar5 = (example *)0x0; peVar5 < in_RCX;
        peVar5 = (example *)((long)&(peVar5->super_example_predict).indices._begin + 1)) {
      pfVar3 = (float *)(in_R9 + (long)peVar5 * 0x20);
      *pfVar3 = (float)*(double *)(*plVar2 + 0x60) * *pfVar3;
    }
  }
  if (((byte)c_1 & 1) != 0) {
    for (peVar5 = (example *)0x0; peVar5 < in_RCX;
        peVar5 = (example *)((long)&(peVar5->super_example_predict).indices._begin + 1)) {
      fVar4 = finalize_prediction((shared_data *)peVar5,0.0);
      *(float *)(in_R9 + (long)peVar5 * 0x20) = fVar4;
    }
  }
  return;
}

Assistant:

void multipredict(
    gd& g, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *g.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (g.all->weights.sparse)
  {
    multipredict_info<sparse_parameters> mp = {
        count, step, pred, g.all->weights.sparse_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    multipredict_info<dense_parameters> mp = {count, step, pred, g.all->weights.dense_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}